

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O0

void __thiscall
S2Polyline::S2Polyline
          (S2Polyline *this,vector<S2LatLng,_std::allocator<S2LatLng>_> *vertices,S2Debug override)

{
  S2Debug override_local;
  vector<S2LatLng,_std::allocator<S2LatLng>_> *vertices_local;
  S2Polyline *this_local;
  
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polyline_0062ebc0;
  this->s2debug_override_ = override;
  this->num_vertices_ = 0;
  std::unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>>::
  unique_ptr<std::default_delete<Vector3<double>[]>,void>
            ((unique_ptr<Vector3<double>[],std::default_delete<Vector3<double>[]>> *)
             &this->vertices_);
  Init(this,vertices);
  return;
}

Assistant:

S2Polyline::S2Polyline(const vector<S2LatLng>& vertices,
                       S2Debug override)
  : s2debug_override_(override) {
  Init(vertices);
}